

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O0

void dumpMap(va_type *value)

{
  bool bVar1;
  const_iterator __lhs;
  const_iterator attr;
  const_iterator in_stack_ffffffffffffffe8;
  
  __lhs = std::
          vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
          ::begin(in_stack_ffffffffffffffe8._M_current);
  while( true ) {
    in_stack_ffffffffffffffe8 =
         std::
         vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
         ::end(in_stack_ffffffffffffffe8._M_current);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_*,_std::vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_*,_std::vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>
                        *)in_stack_ffffffffffffffe8._M_current);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_*,_std::vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>
    ::operator->((__normal_iterator<const_AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_*,_std::vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>
                  *)&stack0xfffffffffffffff0);
    AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>::dump
              ((AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)value);
    __gnu_cxx::
    __normal_iterator<const_AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_*,_std::vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>
    ::operator++((__normal_iterator<const_AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_*,_std::vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>
                  *)&stack0xfffffffffffffff0);
  }
  return;
}

Assistant:

void dumpMap(const va_type& value)
{
	for (va_type::const_iterator attr = value.begin(); attr != value.end(); ++attr)
		attr->dump();
}